

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_planesurface.cpp
# Opt level: O1

bool __thiscall ON_PlaneSurface::Extend(ON_PlaneSurface *this,int dir,ON_Interval *domain)

{
  double dVar1;
  bool bVar2;
  bool bVar3;
  double dVar4;
  double dVar5;
  double *pdVar6;
  bool bVar7;
  ON_Interval *this_00;
  long lVar8;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  double in_XMM1_Qa;
  ON_Interval tdom;
  ON_Interval xdom;
  ON_Interval local_68;
  ON_Interval local_58;
  double local_48;
  ON_Interval local_40;
  
  if ((uint)dir < 2) {
    (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])();
    local_68.m_t[0] = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
    lVar8 = (ulong)(uint)dir * 0x10;
    this_00 = (ON_Interval *)(&this->field_0xb0 + lVar8);
    local_58.m_t[0] = this_00->m_t[0];
    local_58.m_t[1] = *(double *)(&this->field_0xb8 + lVar8);
    local_68.m_t[1] = in_XMM1_Qa;
    dVar4 = ON_Interval::operator[](domain,0);
    (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])(this);
    pdVar6 = ON_Interval::operator[](&local_40,0);
    dVar1 = *pdVar6;
    if (dVar4 < dVar1) {
      dVar5 = ON_Interval::operator[](domain,0);
      pdVar6 = ON_Interval::operator[](&local_68,0);
      *pdVar6 = dVar5;
      dVar5 = ON_Interval::operator[](domain,0);
      dVar5 = ON_Interval::NormalizedParameterAt((ON_Interval *)(&this->field_0x90 + lVar8),dVar5);
      local_48 = ON_Interval::ParameterAt(this_00,dVar5);
      pdVar6 = ON_Interval::operator[](&local_58,0);
      *pdVar6 = local_48;
    }
    dVar5 = ON_Interval::operator[](domain,1);
    (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])
              (this,(ulong)(uint)dir);
    pdVar6 = ON_Interval::operator[](&local_40,1);
    bVar2 = dVar5 != *pdVar6;
    bVar3 = *pdVar6 <= dVar5;
    if (bVar3 && bVar2) {
      dVar5 = ON_Interval::operator[](domain,1);
      pdVar6 = ON_Interval::operator[](&local_68,1);
      *pdVar6 = dVar5;
      dVar5 = ON_Interval::operator[](domain,1);
      dVar5 = ON_Interval::NormalizedParameterAt((ON_Interval *)(&this->field_0x90 + lVar8),dVar5);
      dVar5 = ON_Interval::ParameterAt(this_00,dVar5);
      pdVar6 = ON_Interval::operator[](&local_58,1);
      *pdVar6 = dVar5;
    }
    bVar7 = bVar3 && bVar2 || dVar4 < dVar1;
    if (bVar3 && bVar2 || dVar4 < dVar1) {
      ON_Surface::DestroySurfaceTree(&this->super_ON_Surface);
      *(double *)(&this->field_0x90 + lVar8) = local_68.m_t[0];
      *(double *)((long)(&this->field_0x90 + lVar8) + 8) = local_68.m_t[1];
      this_00->m_t[0] = local_58.m_t[0];
      *(double *)(&this->field_0xb8 + lVar8) = local_58.m_t[1];
    }
  }
  else {
    bVar7 = false;
  }
  return bVar7;
}

Assistant:

bool ON_PlaneSurface::Extend(
      int dir,
      const ON_Interval& domain
      )
{
  if ( dir < 0 || dir > 1 ) return false;
  bool changed = false;
  ON_Interval tdom = Domain(dir);
  ON_Interval xdom = m_extents[dir];

  if (domain[0] < Domain(dir)[0]){
    changed = true;
    tdom[0] = domain[0];
    xdom[0] = m_extents[dir].ParameterAt( m_domain[dir].NormalizedParameterAt(domain[0]));
  }
  if (domain[1] > Domain(dir)[1]){
    changed = true;
    tdom[1] = domain[1];
    xdom[1] = m_extents[dir].ParameterAt( m_domain[dir].NormalizedParameterAt(domain[1]));
  }
  if (!changed) return false;
  DestroySurfaceTree();

  m_domain[dir] = tdom;
  m_extents[dir] = xdom;
  return true;
}